

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O3

void SetCameraMode(Camera camera,int mode)

{
  float __y;
  float __x;
  float __y_00;
  
  __y = camera.target.x - camera.position.x;
  __y_00 = camera.target.y - camera.position.y;
  __x = camera.target.z - camera.position.z;
  CAMERA_1 = SQRT(__y_00 * __y_00 + __y * __y + __x * __x);
  CAMERA_3 = atan2f(__y,__x);
  CAMERA_4 = atan2f(__y_00,SQRT(__x * __x + __y * __y));
  CAMERA_2 = camera.position.y;
  glfwSetInputMode(CORE.Window.handle,0x33001,(uint)(mode - 3U < 2) * 2 + 0x34001);
  CORE.Input.Mouse.cursorHidden = mode - 3U < 2;
  CAMERA_0 = mode;
  return;
}

Assistant:

void SetCameraMode(Camera camera, int mode)
{
    Vector3 v1 = camera.position;
    Vector3 v2 = camera.target;

    float dx = v2.x - v1.x;
    float dy = v2.y - v1.y;
    float dz = v2.z - v1.z;

    CAMERA.targetDistance = sqrtf(dx*dx + dy*dy + dz*dz);   // Distance to target

    // Camera angle calculation
    CAMERA.angle.x = atan2f(dx, dz);                        // Camera angle in plane XZ (0 aligned with Z, move positive CCW)
    CAMERA.angle.y = atan2f(dy, sqrtf(dx*dx + dz*dz));      // Camera angle in plane XY (0 aligned with X, move positive CW)

    CAMERA.playerEyesPosition = camera.position.y;          // Init player eyes position to camera Y position

    // Lock cursor for first person and third person cameras
    if ((mode == CAMERA_FIRST_PERSON) || (mode == CAMERA_THIRD_PERSON)) DisableCursor();
    else EnableCursor();

    CAMERA.mode = mode;
}